

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_setup.cpp
# Opt level: O0

void P_SetSideNum(side_t **sidenum_p,WORD sidenum)

{
  long lVar1;
  WORD sidenum_local;
  side_t **sidenum_p_local;
  
  if (sidenum == 0xffff) {
    *sidenum_p = (side_t *)0x0;
  }
  else if (sidecount < numsides) {
    *(uint *)((long)&sidetemp[sidecount].field_0 + 8) = (uint)sidenum;
    lVar1 = (long)sidecount;
    sidecount = sidecount + 1;
    *sidenum_p = sides + lVar1;
  }
  else {
    I_Error("%d sidedefs is not enough\n",(ulong)(uint)sidecount);
  }
  return;
}

Assistant:

static void P_SetSideNum (side_t **sidenum_p, WORD sidenum)
{
	if (sidenum == NO_INDEX)
	{
		*sidenum_p = NULL;
	}
	else if (sidecount < numsides)
	{
		sidetemp[sidecount].a.map = sidenum;
		*sidenum_p = &sides[sidecount++];
	}
	else
	{
		I_Error ("%d sidedefs is not enough\n", sidecount);
	}
}